

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,Exception *ex)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(stream,"[Exception ");
  pcVar2 = (char *)(**(code **)(*(long *)ex + 0x10))(ex);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"]");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, Exception const* ex) {
  stream << "[Exception " << ex->what() << "]";
  return stream;
}